

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O0

iterator __thiscall
fmt::v10::formatter<ot::commissioner::coap::OptionType,_char,_void>::format
          (formatter<ot::commissioner::coap::OptionType,_char,_void> *this,OptionType optionType,
          format_context *ctx)

{
  arg_ref<char> ref;
  arg_ref<char> ref_00;
  undefined1 out [8];
  char *pcVar1;
  size_t ctx_00;
  undefined8 uVar2;
  iterator this_00;
  undefined6 in_register_00000032;
  v10 *this_01;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar3;
  format_args args;
  string_view fmt;
  basic_string_view<char> s;
  undefined1 local_400 [7];
  v10 local_3f9;
  undefined8 local_3f8;
  char *local_3f0;
  string local_3e8;
  basic_string_view<char> local_3c8;
  buffer<char> *local_3b8;
  buffer<char> *local_3a8;
  buffer<char> *local_398;
  buffer<char> *local_388;
  buffer<char> *local_378;
  buffer<char> *local_368;
  buffer<char> *local_358;
  buffer<char> *local_348;
  buffer<char> *local_338;
  buffer<char> *local_328;
  buffer<char> *local_318;
  buffer<char> *local_308;
  buffer<char> *local_2f8;
  buffer<char> *local_2e8;
  buffer<char> *local_2d8;
  buffer<char> *local_2c8;
  undefined1 local_2b8 [8];
  string_view name;
  format_context *ctx_local;
  OptionType optionType_local;
  formatter<ot::commissioner::coap::OptionType,_char,_void> *this_local;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> *local_188 [5];
  v10 *local_160;
  char *local_158;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> *local_150;
  v10 *local_148;
  char *pcStack_140;
  string *local_138;
  v10 *local_130;
  undefined8 *local_128;
  void *local_120;
  appender local_118;
  char *local_110;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_108;
  size_t local_100;
  undefined1 local_f8 [24];
  undefined1 local_e0 [16];
  int local_d0;
  int iStack_cc;
  dynamic_format_specs<char> specs;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_58;
  
  this_01 = (v10 *)CONCAT62(in_register_00000032,optionType);
  name.size_ = (size_t)ctx;
  basic_string_view<char>::basic_string_view((basic_string_view<char> *)local_2b8);
  switch(optionType) {
  case kIfMatch:
    local_2c8 = (buffer<char> *)0x3ab16d;
    name.data_ = (char *)std::char_traits<char>::length("kIfMatch");
    local_2b8 = (undefined1  [8])local_2c8;
    break;
  default:
    format::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)(local_400 + 6));
    local_128 = &local_3f8;
    local_130 = &local_3f9;
    bVar3 = v10::operator()(local_130);
    local_3f0 = (char *)bVar3.size_;
    local_3f8 = bVar3.data_;
    v10::detail::check_format_string<int,_FMT_COMPILE_STRING,_0>();
    local_400._0_4_ = ZEXT24(optionType);
    local_138 = &local_3e8;
    local_148 = (v10 *)local_3f8;
    pcStack_140 = local_3f0;
    local_150 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> *)
                local_400;
    local_160 = (v10 *)local_3f8;
    local_158 = local_3f0;
    local_188[0] = make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,int>
                             (local_150,this_01,(int *)local_138);
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_188;
    fmt.size_ = 1;
    fmt.data_ = local_158;
    vformat_abi_cxx11_(&local_3e8,local_160,fmt,args);
    basic_string_view<char>::basic_string_view<std::char_traits<char>,std::allocator<char>>
              (&local_3c8,&local_3e8);
    local_2b8 = (undefined1  [8])local_3c8.data_;
    name.data_ = (char *)local_3c8.size_;
    std::__cxx11::string::~string((string *)&local_3e8);
    break;
  case kUriHost:
    local_2d8 = (buffer<char> *)0x3ab176;
    name.data_ = (char *)std::char_traits<char>::length("kUriHost");
    local_2b8 = (undefined1  [8])local_2d8;
    break;
  case kETag:
    local_2e8 = (buffer<char> *)0x3ab17f;
    name.data_ = (char *)std::char_traits<char>::length("kETag");
    local_2b8 = (undefined1  [8])local_2e8;
    break;
  case kIfNonMatch:
    local_2f8 = (buffer<char> *)0x3ab185;
    name.data_ = (char *)std::char_traits<char>::length("kIfNonMatch");
    local_2b8 = (undefined1  [8])local_2f8;
    break;
  case kObserve:
    local_308 = (buffer<char> *)0x3ab191;
    name.data_ = (char *)std::char_traits<char>::length("kObserve");
    local_2b8 = (undefined1  [8])local_308;
    break;
  case kUriPort:
    local_318 = (buffer<char> *)0x3ab19a;
    name.data_ = (char *)std::char_traits<char>::length("kUriPort");
    local_2b8 = (undefined1  [8])local_318;
    break;
  case kLocationPath:
    local_328 = (buffer<char> *)0x3ab1a3;
    name.data_ = (char *)std::char_traits<char>::length("kLocationPath");
    local_2b8 = (undefined1  [8])local_328;
    break;
  case kUriPath:
    local_338 = (buffer<char> *)0x3ab1b1;
    name.data_ = (char *)std::char_traits<char>::length("kUriPath");
    local_2b8 = (undefined1  [8])local_338;
    break;
  case kContentFormat:
    local_348 = (buffer<char> *)0x3ab1ba;
    name.data_ = (char *)std::char_traits<char>::length("kContentFormat");
    local_2b8 = (undefined1  [8])local_348;
    break;
  case kMaxAge:
    local_358 = (buffer<char> *)0x3ab1c9;
    name.data_ = (char *)std::char_traits<char>::length("kMaxAge");
    local_2b8 = (undefined1  [8])local_358;
    break;
  case kUriQuery:
    local_368 = (buffer<char> *)0x3ab1d1;
    name.data_ = (char *)std::char_traits<char>::length("kUriQuery");
    local_2b8 = (undefined1  [8])local_368;
    break;
  case kAccept:
    local_378 = (buffer<char> *)0x3ab1db;
    name.data_ = (char *)std::char_traits<char>::length("kAccept");
    local_2b8 = (undefined1  [8])local_378;
    break;
  case kLocationQuery:
    local_388 = (buffer<char> *)0x3ab1e3;
    name.data_ = (char *)std::char_traits<char>::length("kLocationQuery");
    local_2b8 = (undefined1  [8])local_388;
    break;
  case kProxyUri:
    local_398 = (buffer<char> *)0x3ab1f2;
    name.data_ = (char *)std::char_traits<char>::length("kProxyUri");
    local_2b8 = (undefined1  [8])local_398;
    break;
  case kProxyScheme:
    local_3a8 = (buffer<char> *)0x3ab1fc;
    name.data_ = (char *)std::char_traits<char>::length("kProxyScheme");
    local_2b8 = (undefined1  [8])local_3a8;
    break;
  case kSize1:
    local_3b8 = (buffer<char> *)0x3ab209;
    name.data_ = (char *)std::char_traits<char>::length("kSize1");
    local_2b8 = (undefined1  [8])local_3b8;
  }
  ctx_00 = name.size_;
  if (((this->super_formatter<fmt::v10::basic_string_view<char>,_char,_void>).specs_.width_ref.kind
       == none) &&
     ((this->super_formatter<fmt::v10::basic_string_view<char>,_char,_void>).specs_.precision_ref.
      kind == none)) {
    this_00 = basic_format_context<fmt::v10::appender,_char>::out
                        ((basic_format_context<fmt::v10::appender,_char> *)name.size_);
    pcVar1 = name.data_;
    out = local_2b8;
    specs.precision_ref.val.name.size_ =
         (size_t)basic_format_context<fmt::v10::appender,_char>::locale
                           ((basic_format_context<fmt::v10::appender,_char> *)ctx_00);
    s.size_ = (size_t)this;
    s.data_ = pcVar1;
    local_58.container =
         (buffer<char> *)
         v10::detail::write<char,fmt::v10::appender>
                   (this_00.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,
                    (appender)out,s,(format_specs<char> *)specs.precision_ref.val.name.size_,
                    (locale_ref)in_R9);
  }
  else {
    memcpy(&local_d0,this,0x40);
    uVar2 = specs.super_format_specs<char>._8_8_;
    local_f8[0x10] = specs.super_format_specs<char>.type;
    local_f8._17_2_ = specs.super_format_specs<char>._9_2_;
    local_f8[0x13] = specs.super_format_specs<char>.fill.data_[0];
    local_f8[0x14] = specs.super_format_specs<char>.fill.data_[1];
    local_f8[0x15] = specs.super_format_specs<char>.fill.data_[2];
    local_f8[0x16] = specs.super_format_specs<char>.fill.data_[3];
    local_f8[0x17] = specs.super_format_specs<char>.fill.size_;
    local_e0._0_8_ = specs.width_ref._0_8_;
    local_e0._8_8_ = specs.width_ref.val.name.data_;
    ref.val.name.data_ = (char *)specs.width_ref._0_8_;
    ref._0_8_ = uVar2;
    ref.val.name.size_ = (size_t)specs.width_ref.val.name.data_;
    v10::detail::
    handle_dynamic_spec<fmt::v10::detail::width_checker,fmt::v10::basic_format_context<fmt::v10::appender,char>>
              (&local_d0,ref,(basic_format_context<fmt::v10::appender,_char> *)ctx_00);
    local_100 = specs.width_ref.val.name.size_;
    local_f8._0_8_ = specs.precision_ref._0_8_;
    local_f8._8_8_ = specs.precision_ref.val.name.data_;
    ref_00.val.name.data_ = (char *)specs.precision_ref._0_8_;
    ref_00._0_8_ = specs.width_ref.val.name.size_;
    ref_00.val.name.size_ = (size_t)specs.precision_ref.val.name.data_;
    v10::detail::
    handle_dynamic_spec<fmt::v10::detail::precision_checker,fmt::v10::basic_format_context<fmt::v10::appender,char>>
              (&iStack_cc,ref_00,(basic_format_context<fmt::v10::appender,_char> *)ctx_00);
    local_108.container =
         (buffer<char> *)
         basic_format_context<fmt::v10::appender,_char>::out
                   ((basic_format_context<fmt::v10::appender,_char> *)ctx_00);
    local_118.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container =
         (back_insert_iterator<fmt::v10::detail::buffer<char>_>)
         (back_insert_iterator<fmt::v10::detail::buffer<char>_>)local_2b8;
    local_110 = name.data_;
    local_120 = (void *)basic_format_context<fmt::v10::appender,_char>::locale
                                  ((basic_format_context<fmt::v10::appender,_char> *)ctx_00);
    bVar3.size_ = (size_t)&local_d0;
    bVar3.data_ = local_110;
    local_58.container =
         (buffer<char> *)
         v10::detail::write<char,fmt::v10::appender>
                   (local_108.container,local_118,bVar3,(format_specs<char> *)local_120,
                    (locale_ref)in_R9);
  }
  return (iterator)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)local_58.container;
}

Assistant:

auto fmt::formatter<ot::commissioner::coap::OptionType>::format(ot::commissioner::coap::OptionType optionType,
                                                                format_context &ctx) -> decltype(ctx.out())
{
    using ot::commissioner::coap::OptionType;
    string_view name;
    switch (optionType)
    {
    case OptionType::kIfMatch:
        name = "kIfMatch";
        break;
    case OptionType::kUriHost:
        name = "kUriHost";
        break;
    case OptionType::kETag:
        name = "kETag";
        break;
    case OptionType::kIfNonMatch:
        name = "kIfNonMatch";
        break;
    case OptionType::kObserve:
        name = "kObserve";
        break;
    case OptionType::kUriPort:
        name = "kUriPort";
        break;
    case OptionType::kLocationPath:
        name = "kLocationPath";
        break;
    case OptionType::kUriPath:
        name = "kUriPath";
        break;
    case OptionType::kContentFormat:
        name = "kContentFormat";
        break;
    case OptionType::kMaxAge:
        name = "kMaxAge";
        break;
    case OptionType::kUriQuery:
        name = "kUriQuery";
        break;
    case OptionType::kAccept:
        name = "kAccept";
        break;
    case OptionType::kLocationQuery:
        name = "kLocationQuery";
        break;
    case OptionType::kProxyUri:
        name = "kProxyUri";
        break;
    case OptionType::kProxyScheme:
        name = "kProxyScheme";
        break;
    case OptionType::kSize1:
        name = "kSize1";
        break;
    default:
        name = fmt::format(FMT_STRING("unknown({})"), static_cast<int>(optionType));
    }
    return formatter<string_view>::format(name, ctx);
}